

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool tinyusdz::usda::anon_unknown_1::ToPrimSpecRec
               (size_t primSpecIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
               *primspec_nodes,PrimSpec *parent,string *err)

{
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference rhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
  *this;
  ulong *puVar5;
  PrimMetas *pPVar6;
  PrimMeta *this_00;
  PropertyMap *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *this_02;
  reference puVar7;
  size_type sVar8;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *pvVar9;
  undefined1 local_1788 [8];
  PrimSpec childPrimSpec;
  unsigned_long *cidx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_11c8 [8];
  PrimSpec variantChildPrim;
  string local_c58;
  string local_c38;
  ulong local_c18;
  int64_t vidx;
  const_iterator __end5;
  const_iterator __begin5;
  vector<long,_std::allocator<long>_> *__range5;
  PrimSpec variant;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>
  *item;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
  *__range4;
  VariantSetSpec variantSet;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>
  *variantNodes;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  variantSets;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  PrimSpec primspec;
  PrimSpecNode *node;
  string *err_local;
  PrimSpec *parent_local;
  vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  *primspec_nodes_local;
  size_t primSpecIdx_local;
  
  sVar4 = ::std::
          vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
          ::size(primspec_nodes);
  if (primSpecIdx < sVar4) {
    rhs = ::std::
          vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
          ::operator[](primspec_nodes,primSpecIdx);
    PrimSpec::PrimSpec((PrimSpec *)
                       &variantChildrenIndices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &rhs->primSpec);
    ::std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
           *)&__range3);
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
             ::begin(&rhs->variantNodeMap);
    variantNodes = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>
                    *)::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
                      ::end(&rhs->variantNodeMap);
    while (bVar3 = ::std::operator!=(&__end3,(_Self *)&variantNodes), bVar3) {
      variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)::std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>
                   ::operator*(&__end3);
      VariantSetSpec::VariantSetSpec((VariantSetSpec *)&__range4);
      this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
              *)(variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
      __end4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
               ::begin(this);
      item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
                ::end(this);
      while (bVar3 = ::std::operator!=(&__end4,(_Self *)&item), bVar3) {
        variant._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>
                      ::operator*(&__end4);
        PrimSpec::PrimSpec((PrimSpec *)&__range5);
        pbVar1 = variant._asset_search_paths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x22;
        __end5._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)&pbVar1->_M_string_length);
        vidx = (int64_t)std::vector<long,_std::allocator<long>_>::end
                                  ((vector<long,_std::allocator<long>_> *)&pbVar1->_M_string_length)
        ;
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                           *)&vidx), bVar3) {
          puVar5 = (ulong *)__gnu_cxx::
                            __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                            ::operator*(&__end5);
          local_c18 = *puVar5;
          sVar8 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type_conflict *)&local_c18);
          uVar2 = local_c18;
          if (sVar8 != 0) {
            if (err != (string *)0x0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_c58,"variant primIdx {} is referenced multiple times.\n",
                         (allocator *)
                         ((long)&variantChildPrim._asset_search_paths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              fmt::format<long>(&local_c38,&local_c58,(long *)&local_c18);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_c38);
              ::std::__cxx11::string::~string((string *)&local_c38);
              ::std::__cxx11::string::~string((string *)&local_c58);
              ::std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&variantChildPrim._asset_search_paths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            }
            primSpecIdx_local._7_1_ = 0;
            variantChildPrim._asset_search_paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_0014d65e;
          }
          if (((long)local_c18 < 0) ||
             (sVar4 = ::std::
                      vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                      ::size(primspec_nodes), sVar4 < uVar2)) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::operator=
                        ((string *)err,"primIndex exceeds prim_nodes.size()\n");
            }
            primSpecIdx_local._7_1_ = 0;
            variantChildPrim._asset_search_paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_0014d65e;
          }
          PrimSpec::PrimSpec((PrimSpec *)local_11c8);
          bVar3 = ToPrimSpecRec(local_c18,primspec_nodes,(PrimSpec *)local_11c8,err);
          if (bVar3) {
            pvVar9 = PrimSpec::children((PrimSpec *)&__range5);
            ::std::vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>>::
            emplace_back<tinyusdz::PrimSpec&>
                      ((vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>> *)pvVar9,
                       (PrimSpec *)local_11c8);
          }
          else {
            primSpecIdx_local._7_1_ = 0;
          }
          variantChildPrim._asset_search_paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
          variantChildPrim._asset_search_paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar3;
          PrimSpec::~PrimSpec((PrimSpec *)local_11c8);
          if ((uint)variantChildPrim._asset_search_paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0014d65e;
          ::std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)
                     &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (value_type_conflict4 *)&local_c18);
          __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&__end5);
        }
        pPVar6 = (PrimMetas *)
                 (variant._asset_search_paths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        this_00 = PrimSpec::metas((PrimSpec *)&__range5);
        PrimMetas::operator=(this_00,pPVar6);
        pbVar1 = variant._asset_search_paths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x20;
        this_01 = PrimSpec::props_abi_cxx11_((PrimSpec *)&__range5);
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::operator=(this_01,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)((long)&pbVar1->field_2 + 8));
        ::std::__cxx11::string::operator=
                  ((string *)&__range4,
                   (string *)variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        ::std::
        map<std::__cxx11::string,tinyusdz::PrimSpec,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
        ::emplace<std::__cxx11::string_const&,tinyusdz::PrimSpec>
                  ((map<std::__cxx11::string,tinyusdz::PrimSpec,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
                    *)(variantSet.name.field_2._M_local_buf + 8),
                   variant._asset_search_paths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(PrimSpec *)&__range5);
        variantChildPrim._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_0014d65e:
        PrimSpec::~PrimSpec((PrimSpec *)&__range5);
        if ((uint)variantChildPrim._asset_search_paths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0014d6ba;
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>
        ::operator++(&__end4);
      }
      ::std::
      map<std::__cxx11::string,tinyusdz::VariantSetSpec,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
      ::emplace<std::__cxx11::string_const&,tinyusdz::VariantSetSpec>
                ((map<std::__cxx11::string,tinyusdz::VariantSetSpec,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
                  *)&__range3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (VariantSetSpec *)&__range4);
      variantChildPrim._asset_search_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_0014d6ba:
      VariantSetSpec::~VariantSetSpec((VariantSetSpec *)&__range4);
      if ((uint)variantChildPrim._asset_search_paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0014d70a;
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>
      ::operator++(&__end3);
    }
    this_02 = PrimSpec::variantSets_abi_cxx11_
                        ((PrimSpec *)
                         &variantChildrenIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::operator=(this_02,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                         *)&__range3);
    variantChildPrim._asset_search_paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
LAB_0014d70a:
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
            *)&__range3);
    if ((uint)variantChildPrim._asset_search_paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      __end2._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rhs->children);
      cidx = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rhs->children);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&cidx), bVar3) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
        childPrimSpec._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar7;
        sVar8 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                          ((set<long,_std::less<long>,_std::allocator<long>_> *)
                           &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type_conflict *)
                           &childPrimSpec._asset_search_paths.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar8 == 0) {
          PrimSpec::PrimSpec((PrimSpec *)local_1788);
          bVar3 = ToPrimSpecRec(*puVar7,primspec_nodes,(PrimSpec *)local_1788,err);
          if (bVar3) {
            pvVar9 = PrimSpec::children((PrimSpec *)
                                        &variantChildrenIndices._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>
                      ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar9,
                       (PrimSpec *)local_1788);
          }
          else {
            primSpecIdx_local._7_1_ = 0;
          }
          variantChildPrim._asset_search_paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
          variantChildPrim._asset_search_paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar3;
          PrimSpec::~PrimSpec((PrimSpec *)local_1788);
          if ((uint)variantChildPrim._asset_search_paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0014d864;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
      PrimSpec::operator=(parent,(PrimSpec *)
                                 &variantChildrenIndices._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
      primSpecIdx_local._7_1_ = 1;
      variantChildPrim._asset_search_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
LAB_0014d864:
    ::std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    PrimSpec::~PrimSpec((PrimSpec *)
                        &variantChildrenIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=
                ((string *)err,"Internal error; primSpecIdx exceeds primspec_nodes.size.");
    }
    primSpecIdx_local._7_1_ = 0;
  }
  return (bool)(primSpecIdx_local._7_1_ & 1);
}

Assistant:

bool ToPrimSpecRec(const size_t primSpecIdx,
                        std::vector<PrimSpecNode> &primspec_nodes, PrimSpec &parent, std::string *err) {

  if (primSpecIdx >= primspec_nodes.size()) {
    if (err) {
      (*err) += "Internal error; primSpecIdx exceeds primspec_nodes.size.";
    }
    return false;
  }

  const PrimSpecNode &node = primspec_nodes[primSpecIdx];

  PrimSpec primspec = node.primSpec;

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices
  {

    std::map<std::string, VariantSetSpec> variantSets;
    for (const auto &variantNodes : node.variantNodeMap) {
      DCOUT("variantSet " << variantNodes.first);
      VariantSetSpec variantSet;
      for (const auto &item : variantNodes.second) {
        DCOUT("variant " << item.first);
        PrimSpec variant; // variantNode can be represented as PrimSpec.
        for (const int64_t vidx : item.second.primChildren) {
          if (variantChildrenIndices.count(vidx)) {
            // Duplicated variant childrenIndices
            if (err) {
              (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
            }
            return false;
          } else {
            // Add prim to variants
            if ((vidx >= 0) && (size_t(vidx) <= primspec_nodes.size())) {

              PrimSpec variantChildPrim; // dummy
              if (!ToPrimSpecRec(size_t(vidx), primspec_nodes, variantChildPrim, err)) {
                return false;
              }

              DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.name(), variantNodes.first, item.first));
              variant.children().emplace_back(variantChildPrim);
            } else {
              if (err) {
                (*err) = "primIndex exceeds prim_nodes.size()\n";
              }
              return false;
            }

            variantChildrenIndices.insert(vidx);
          }
        }

        variant.metas() = std::move(item.second.metas);
        variant.props() = std::move(item.second.props);

        variantSet.name = variantNodes.first;
        variantSet.variantSet.emplace(item.first, std::move(variant));
      }
      DCOUT(fmt::format("Add {} to variantSet", variantNodes.first));
      variantSets.emplace(variantNodes.first, std::move(variantSet));
    }
    primspec.variantSets() = std::move(variantSets);
  }

  for (const auto &cidx : node.children) {

    if (variantChildrenIndices.count(int64_t(cidx))) {
      // PrimSpec is already processed
      continue;
    }

    PrimSpec childPrimSpec;
    if (!ToPrimSpecRec(cidx, primspec_nodes, childPrimSpec, err)) {
      return false;
    }
    primspec.children().emplace_back(std::move(childPrimSpec));
  }

  parent = std::move(primspec);

  return true;
}